

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_pool16c_r6_insn(DisasContext_conflict6 *ctx)

{
  TCGContext_conflict6 *tcg_ctx;
  uint uVar1;
  int iVar2;
  uintptr_t o_1;
  ulong uVar3;
  TCGv_i64 a2;
  TCGv_i64 pTVar4;
  uintptr_t o;
  uint uVar5;
  TCGOpcode TVar6;
  uint32_t uVar7;
  int16_t offset;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  
  uVar5 = ctx->opcode;
  uVar1 = uVar5 >> 7 & 7;
  iVar9 = *(int *)(xlat_map + (ulong)uVar1 * 4);
  uVar8 = uVar5 >> 4;
  uVar11 = uVar8 & 7;
  iVar10 = *(int *)(xlat_map + (ulong)uVar11 * 4);
  iVar2 = iVar9;
  switch(uVar5 & 0xf) {
  case 0:
    uVar7 = 0x27;
    iVar2 = iVar10;
    iVar10 = 0;
    break;
  case 1:
    uVar7 = 0x24;
    break;
  case 2:
    offset = (int16_t)((uVar8 & 0xf) << 2);
    uVar7 = 5;
    goto LAB_009c27b7;
  case 3:
    if ((uVar5 & 0x10) != 0) {
      gen_compute_branch(ctx,8,2,0x1f,0,0,0);
      gen_arith_imm(ctx,0x24000000,0x1d,0x1d,uVar5 >> 3 & 0x7c);
      return;
    }
    uVar7 = 8;
    iVar9 = 0;
LAB_009c283c:
    gen_compute_branch(ctx,uVar7,2,uVar5 >> 5 & 0x1f,iVar9,0,0);
switchD_009c2818_default:
    return;
  default:
    uVar3 = (ulong)(uVar1 << 2);
    uVar5 = uVar5 >> 1 & 4 | uVar5 & 3;
    tcg_ctx = ctx->uc->tcg_ctx;
    iVar9 = *(int *)((long)gen_movep::rd_enc + uVar3);
    iVar10 = *(int *)((long)gen_movep::re_enc + uVar3);
    iVar2 = gen_movep::rs_rt_enc[uVar11];
    if (uVar5 == 0) {
      pTVar4 = tcg_ctx->cpu_gpr[iVar9];
      TVar6 = INDEX_op_movi_i64;
      a2 = (TCGv_i64)0x0;
    }
    else {
      pTVar4 = tcg_ctx->cpu_gpr[iVar9];
      if (pTVar4 == tcg_ctx->cpu_gpr[gen_movep::rs_rt_enc[uVar5]]) goto LAB_009c2729;
      a2 = (TCGv_i64)
           ((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[gen_movep::rs_rt_enc[uVar5]]);
      TVar6 = INDEX_op_mov_i64;
    }
    tcg_gen_op2_mips64el(tcg_ctx,TVar6,(TCGArg)((long)&tcg_ctx->pool_cur + (long)pTVar4),(TCGArg)a2)
    ;
LAB_009c2729:
    if (uVar11 == 0) {
      TVar6 = INDEX_op_movi_i64;
      pTVar4 = (TCGv_i64)0x0;
    }
    else {
      if (tcg_ctx->cpu_gpr[iVar10] == tcg_ctx->cpu_gpr[iVar2]) {
        return;
      }
      pTVar4 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[iVar2]);
      TVar6 = INDEX_op_mov_i64;
    }
    tcg_gen_op2_mips64el
              (tcg_ctx,TVar6,(TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[iVar10]),
               (TCGArg)pTVar4);
    return;
  case 8:
    uVar7 = 0x26;
    break;
  case 9:
    uVar7 = 0x25;
    break;
  case 10:
    offset = (int16_t)((uVar8 & 0xf) << 2);
    uVar7 = 0xd;
LAB_009c27b7:
    gen_ldst_multiple(ctx,uVar7,(uVar5 >> 8 & 3) + 0x11,0x1d,offset);
    return;
  case 0xb:
    uVar1 = (uVar5 & 0x3f) - 0xb;
    switch(uVar1 * 0x10000000 | uVar1 >> 4) {
    case 0:
    case 2:
      uVar7 = 9;
      iVar9 = 0x1f;
      goto LAB_009c283c;
    case 1:
      iVar9 = 0x12;
      break;
    case 3:
      if ((ctx->hflags & 0x400000) == 0) {
        iVar9 = 0x10;
      }
      else {
        iVar9 = 0x14;
      }
      break;
    default:
      goto switchD_009c2818_default;
    }
    generate_exception(ctx,iVar9);
    return;
  }
  gen_logic(ctx,uVar7,iVar9,iVar2,iVar10);
  return;
}

Assistant:

static void gen_pool16c_r6_insn(DisasContext *ctx)
{
    int rt = mmreg((ctx->opcode >> 7) & 0x7);
    int rs = mmreg((ctx->opcode >> 4) & 0x7);

    switch (ctx->opcode & 0xf) {
    case R6_NOT16:
        gen_logic(ctx, OPC_NOR, rt, rs, 0);
        break;
    case R6_AND16:
        gen_logic(ctx, OPC_AND, rt, rt, rs);
        break;
    case R6_LWM16:
        {
            int lwm_converted = 0x11 + extract32(ctx->opcode, 8, 2);
            int offset = extract32(ctx->opcode, 4, 4);
            gen_ldst_multiple(ctx, LWM32, lwm_converted, 29, offset << 2);
        }
        break;
    case R6_JRC16: /* JRCADDIUSP */
        if ((ctx->opcode >> 4) & 1) {
            /* JRCADDIUSP */
            int imm = extract32(ctx->opcode, 5, 5);
            gen_compute_branch(ctx, OPC_JR, 2, 31, 0, 0, 0);
            gen_arith_imm(ctx, OPC_ADDIU, 29, 29, imm << 2);
        } else {
            /* JRC16 */
            rs = extract32(ctx->opcode, 5, 5);
            gen_compute_branch(ctx, OPC_JR, 2, rs, 0, 0, 0);
        }
        break;
    case MOVEP:
    case MOVEP_05:
    case MOVEP_06:
    case MOVEP_07:
    case MOVEP_0C:
    case MOVEP_0D:
    case MOVEP_0E:
    case MOVEP_0F:
        {
            int enc_dest = uMIPS_RD(ctx->opcode);
            int enc_rt = uMIPS_RS2(ctx->opcode);
            int enc_rs = (ctx->opcode & 3) | ((ctx->opcode >> 1) & 4);
            gen_movep(ctx, enc_dest, enc_rt, enc_rs);
        }
        break;
    case R6_XOR16:
        gen_logic(ctx, OPC_XOR, rt, rt, rs);
        break;
    case R6_OR16:
        gen_logic(ctx, OPC_OR, rt, rt, rs);
        break;
    case R6_SWM16:
        {
            int swm_converted = 0x11 + extract32(ctx->opcode, 8, 2);
            int offset = extract32(ctx->opcode, 4, 4);
            gen_ldst_multiple(ctx, SWM32, swm_converted, 29, offset << 2);
        }
        break;
    case JALRC16: /* BREAK16, SDBBP16 */
        switch (ctx->opcode & 0x3f) {
        case JALRC16:
        case JALRC16 + 0x20:
            /* JALRC16 */
            gen_compute_branch(ctx, OPC_JALR, 2, (ctx->opcode >> 5) & 0x1f,
                               31, 0, 0);
            break;
        case R6_BREAK16:
            /* BREAK16 */
            generate_exception(ctx, EXCP_BREAK);
            break;
        case R6_SDBBP16:
            /* SDBBP16 */
            if (is_uhi(extract32(ctx->opcode, 6, 4))) {
                // gen_helper_do_semihosting(tcg_ctx, tcg_ctx->cpu_env);
            } else {
                if (ctx->hflags & MIPS_HFLAG_SBRI) {
                    generate_exception(ctx, EXCP_RI);
                } else {
                    generate_exception(ctx, EXCP_DBp);
                }
            }
            break;
        }
        break;
    default:
        generate_exception(ctx, EXCP_RI);
        break;
    }
}